

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O1

ngram_model_t * ps_get_lm(ps_decoder_t *ps,char *name)

{
  ps_search_t *ppVar1;
  int iVar2;
  ps_search_t **val;
  void *search;
  ps_search_t *local_10;
  
  local_10 = (ps_search_t *)0x0;
  if (name == (char *)0x0) {
    val = &ps->search;
  }
  else {
    val = &local_10;
    hash_table_lookup(ps->searches,name,val);
  }
  ppVar1 = *val;
  if ((ppVar1 != (ps_search_t *)0x0) && (iVar2 = strcmp("ngram",ppVar1->type), iVar2 == 0)) {
    return (ngram_model_t *)ppVar1[1].vt;
  }
  return (ngram_model_t *)0x0;
}

Assistant:

ngram_model_t *
ps_get_lm(ps_decoder_t *ps, const char *name)
{
    ps_search_t *search =  ps_find_search(ps, name);
    if (search == NULL)
        return NULL;
    if (0 != strcmp(PS_SEARCH_TYPE_NGRAM, ps_search_type(search)))
        return NULL;
    return ((ngram_search_t *) search)->lmset;
}